

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getSlacks(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *p_vector)

{
  bool bVar1;
  Representation RVar2;
  Status SVar3;
  Status SVar4;
  undefined8 uVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Desc *ds;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe50;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe58;
  DataKey local_164;
  SPxRowId local_15c;
  undefined1 local_154 [80];
  DataKey local_104;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [36];
  undefined4 local_d4;
  Desc *local_d0;
  int local_c4;
  undefined1 local_bd;
  allocator local_a9;
  string local_a8 [32];
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_88;
  undefined4 *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined4 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_88 = in_RSI;
  bVar1 = isInitialized(in_RDI);
  if (bVar1) {
    RVar2 = rep(in_RDI);
    if (RVar2 == COLUMN) {
      local_d0 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::desc(&in_RDI->
                         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
      local_c4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x4c8653);
      while (local_c4 = local_c4 + -1, -1 < local_c4) {
        SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::rowStatus((Desc *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        switch(SVar3) {
        case D_FREE:
        case D_ON_UPPER:
        case D_ON_LOWER:
        case D_ON_BOTH:
        case D_UNDEFINED:
          break;
        case P_FIXED:
        case P_ON_UPPER:
          pnVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::rhs(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          local_50 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          local_58 = pnVar6;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffe50,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          break;
        default:
          local_fa = 1;
          uVar5 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f8,"XSOLVE12 This should never happen.",&local_f9);
          SPxInternalCodeException::SPxInternalCodeException
                    ((SPxInternalCodeException *)in_stack_fffffffffffffe50,
                     (string *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          local_fa = 0;
          __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        case P_ON_LOWER:
          pnVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::lhs(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          local_40 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          local_48 = pnVar6;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffe50,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          break;
        case P_FREE:
          local_d4 = 0;
          local_70 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          local_78 = &local_d4;
          local_38 = local_78;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffe50,
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
      }
      local_c4 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x4c88c6);
      while (local_c4 = local_c4 + -1, -1 < local_c4) {
        local_104 = (DataKey)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT44(in_stack_fffffffffffffe4c,
                                                  in_stack_fffffffffffffe48),0);
        bVar1 = SPxId::isSPxRowId((SPxId *)&local_104);
        if (bVar1) {
          local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          local_20 = local_154;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = local_154;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffe50,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          local_8 = local_154;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffe50);
          in_stack_fffffffffffffe50 = local_88;
          local_164 = (DataKey)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(in_stack_fffffffffffffe4c,
                                                    in_stack_fffffffffffffe48),0);
          SPxRowId::SPxRowId(&local_15c,(SPxId *)&local_164);
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::number(in_stack_fffffffffffffe50,
                   (SPxRowId *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          local_60 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          local_68 = local_154;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffe50,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
      }
    }
    else {
      pVec(in_RDI);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffffe50,
                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    SVar4 = status(in_stack_fffffffffffffe58);
    return SVar4;
  }
  local_bd = 1;
  uVar5 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"XSOLVE11 No Problem loaded",&local_a9);
  SPxStatusException::SPxStatusException
            ((SPxStatusException *)in_stack_fffffffffffffe50,
             (string *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_bd = 0;
  __cxa_throw(uVar5,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getSlacks(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE11 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == COLUMN)
   {
      int i;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(i = this->nRows() - 1; i >= 0; --i)
      {
         switch(ds.rowStatus(i))
         {
         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            p_vector[i] = this->lhs(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::P_FIXED :
            p_vector[i] = this->rhs(i);
            break;

         case SPxBasisBase<R>::Desc::P_FREE :
            p_vector[i] = 0;
            break;

         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_BOTH :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
            break;

         default:
            throw SPxInternalCodeException("XSOLVE12 This should never happen.");
         }
      }

      for(i = dim() - 1; i >= 0; --i)
      {
         if(this->baseId(i).isSPxRowId())
            p_vector[ this->number(SPxRowId(this->baseId(i))) ] = -(*theFvec)[i];
      }
   }
   else
      p_vector = pVec();

   return status();
}